

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::ExportModuleField::ExportModuleField(ExportModuleField *this,Location *loc)

{
  size_type sVar1;
  size_t sVar2;
  undefined8 uVar3;
  
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__ModuleField_013e1458;
  sVar1 = (loc->filename).size_;
  sVar2 = (loc->field_1).field_1.offset;
  uVar3 = *(undefined8 *)((long)&loc->field_1 + 8);
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.loc.filename.data_ =
       (loc->filename).data_;
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.loc.filename.size_ =
       sVar1;
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.loc.field_1.field_1.
  offset = sVar2;
  *(undefined8 *)
   ((long)&(this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.loc.field_1 +
   8) = uVar3;
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.type_ = Export;
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__ExportModuleField_013e1868;
  Export::Export(&this->export_);
  return;
}

Assistant:

explicit ExportModuleField(const Location& loc = Location())
      : ModuleFieldMixin<ModuleFieldType::Export>(loc) {}